

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void Int2StrConvert<unsigned_short>(void)

{
  _Setprecision _Var1;
  ostream *poVar2;
  char *pcVar3;
  rep rVar4;
  unsigned_short local_6a;
  undefined1 local_68 [6];
  unsigned_short i;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  unsigned_short _imax;
  unsigned_short _imin;
  ResultType _result;
  char buf [64];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"[");
  pcVar3 = std::type_info::name((type_info *)&unsigned_short::typeinfo);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"] ");
  poVar2 = std::operator<<(poVar2,"int2str::convert");
  poVar2 = std::operator<<(poVar2,"... ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  _prof.mStart.__d.__r._6_2_ = 0;
  _prof.mStart.__d.__r._4_2_ = 0xffff;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)local_68,
             (duration<double,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffffb0);
  for (local_6a = 0; local_6a != 0xffff; local_6a = local_6a + 1) {
    int2str::convert_with_zero<unsigned_short,char*>(local_6a,(char *)&_result);
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)local_68);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
  _Var1 = std::setprecision(3);
  poVar2 = std::operator<<(poVar2,_Var1);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffffb0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar4);
  poVar2 = std::operator<<(poVar2,"s");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Int2StrConvert()
{
#ifdef _MSC_VER  
    static char buf[64];
#else
    char buf[64];
#endif
    PROFILING_BEGIN(T, "int2str::convert")
    int2str::convert_with_zero(i, buf);
    PROFILING_END()
}